

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Configure(cmake *this)

{
  cmState *pcVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  char *local_138;
  char *delCacheVars;
  int ret;
  allocator local_101;
  string local_100;
  char *local_e0;
  char *cachedErrorDeprecated;
  string local_d0;
  char *local_b0;
  char *cachedWarnDeprecated;
  undefined1 local_a0 [6];
  bool setDeprecatedVariables;
  allocator local_79;
  key_type local_78;
  allocator local_41;
  key_type local_40;
  mapped_type local_1c;
  cmake *pcStack_18;
  DiagLevel diagLevel;
  cmake *this_local;
  
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"deprecated",&local_41);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (sVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"deprecated",&local_79);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,&local_78);
    local_1c = *pmVar3;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (local_1c == DIAG_IGNORE) {
      SetSuppressDeprecatedWarnings(this,true);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_1c == DIAG_WARN) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_1c == DIAG_ERROR) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,true);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_a0,"dev",(allocator *)((long)&cachedWarnDeprecated + 7));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,(key_type *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cachedWarnDeprecated + 7));
  if (sVar2 == 1) {
    cachedWarnDeprecated._6_1_ = 0;
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,"CMAKE_WARN_DEPRECATED",
               (allocator *)((long)&cachedErrorDeprecated + 7));
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cachedErrorDeprecated + 7));
    pcVar1 = this->State;
    local_b0 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"CMAKE_ERROR_DEPRECATED",&local_101);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    if ((local_b0 == (char *)0x0) && (pcVar4 == (char *)0x0)) {
      cachedWarnDeprecated._6_1_ = 1;
    }
    local_e0 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&ret,"dev",(allocator *)((long)&delCacheVars + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,(key_type *)&ret);
    local_1c = *pmVar3;
    std::__cxx11::string::~string((string *)&ret);
    std::allocator<char>::~allocator((allocator<char> *)((long)&delCacheVars + 7));
    if (local_1c == DIAG_IGNORE) {
      SetSuppressDevWarnings(this,true);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,true);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_1c == DIAG_WARN) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_1c == DIAG_ERROR) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,true);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,true);
      }
    }
  }
  delCacheVars._0_4_ = ActualConfigure(this);
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_159);
  pcVar4 = cmState::GetGlobalProperty(pcVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    this_local._4_4_ = (int)delCacheVars;
  }
  else {
    local_138 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,pcVar4,&local_181);
    this_local._4_4_ = HandleDeleteCacheVariables(this,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  int ret = this->ActualConfigure();
  const char* delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && delCacheVars[0] != 0) {
    return this->HandleDeleteCacheVariables(delCacheVars);
  }
  return ret;
}